

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
AdapterPromiseNode<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo,_kj::_::PromiseAndFulfillerAdapter<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>_>
::reject(AdapterPromiseNode<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo,_kj::_::PromiseAndFulfillerAdapter<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>_>
         *this,Exception *exception)

{
  undefined8 uVar1;
  ExceptionOr<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo> local_190;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_190.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_190.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         (exception->ownFile).content.ptr;
    local_190.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         (exception->ownFile).content.size_;
    local_190.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         (exception->ownFile).content.disposer;
    (exception->ownFile).content.ptr = (char *)0x0;
    (exception->ownFile).content.size_ = 0;
    local_190.super_ExceptionOrValue.exception.ptr.field_1.value.file = exception->file;
    local_190.super_ExceptionOrValue.exception.ptr.field_1._32_4_ = exception->line;
    local_190.super_ExceptionOrValue.exception.ptr.field_1._36_4_ = exception->type;
    local_190.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (exception->description).content.ptr;
    local_190.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         (exception->description).content.size_;
    (exception->description).content.ptr = (char *)0x0;
    (exception->description).content.size_ = 0;
    local_190.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         (exception->description).content.disposer;
    local_190.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         (exception->context).ptr.disposer;
    local_190.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         (exception->context).ptr.ptr;
    (exception->context).ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&local_190.super_ExceptionOrValue.exception.ptr.field_1 + 0x50),
           exception->trace,0x104);
    local_190.value.ptr.isSet = false;
    ExceptionOr<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>::operator=
              (&this->result,&local_190);
    uVar1 = local_190.value.ptr.field_1.value.shutdownPromise.super_PromiseBase.node.ptr;
    if ((local_190.value.ptr.isSet == true) &&
       (local_190.value.ptr.field_1.value.shutdownPromise.super_PromiseBase.node.ptr !=
        (PromiseNode *)0x0)) {
      local_190.value.ptr.field_1.value.shutdownPromise.super_PromiseBase.node.ptr =
           (PromiseNode *)0x0;
      (**(local_190.value.ptr.field_1.value.shutdownPromise.super_PromiseBase.node.disposer)->
         _vptr_Disposer)(local_190.value.ptr.field_1.value.shutdownPromise.super_PromiseBase.node.
                         disposer,(_func_int *)
                                  ((long)&((PromiseNode *)uVar1)->_vptr_PromiseNode +
                                  (long)((PromiseNode *)uVar1)->_vptr_PromiseNode[-2]));
    }
    if (local_190.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_190.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }